

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
SubcommandProgram_CallbackOrder_Test::TestBody(SubcommandProgram_CallbackOrder_Test *this)

{
  App *pAVar1;
  initializer_list<int> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<int> __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  bool bVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  AssertHelper local_1f8;
  Message local_1f0;
  allocator<int> local_1e1;
  int local_1e0 [2];
  iterator local_1d8;
  size_type local_1d0;
  vector<int,_std::allocator<int>_> local_1c8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170 [32];
  iterator local_150;
  size_type local_148;
  AssertHelper local_140;
  Message local_138;
  allocator<int> local_129;
  int local_128 [2];
  iterator local_120;
  size_type local_118;
  vector<int,_std::allocator<int>_> local_110;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8 [32];
  iterator local_98;
  size_type local_90;
  undefined1 local_88 [56];
  anon_class_8_1_998c6512 local_50;
  function<void_()> local_48;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> callback_order;
  SubcommandProgram_CallbackOrder_Test *this_local;
  
  callback_order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  CLI::std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_28)
  ;
  pAVar1 = (this->super_SubcommandProgram).start;
  local_50.callback_order = (vector<int,_std::allocator<int>_> *)local_28;
  std::function<void()>::function<SubcommandProgram_CallbackOrder_Test::TestBody()::__0,void>
            ((function<void()> *)&local_48,&local_50);
  CLI::App::set_callback(pAVar1,&local_48);
  CLI::std::function<void_()>::~function(&local_48);
  pAVar1 = (this->super_SubcommandProgram).stop;
  local_88._0_8_ = local_28;
  std::function<void()>::function<SubcommandProgram_CallbackOrder_Test::TestBody()::__1,void>
            ((function<void()> *)(local_88 + 8),(anon_class_8_1_998c6512 *)local_88);
  CLI::App::set_callback(pAVar1,(function<void_()> *)(local_88 + 8));
  CLI::std::function<void_()>::~function((function<void_()> *)(local_88 + 8));
  gtest_ar.message_.ptr_._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d8,"start",(allocator *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"stop",(allocator *)((long)&gtest_ar.message_.ptr_ + 6));
  gtest_ar.message_.ptr_._5_1_ = 0;
  local_98 = &local_d8;
  local_90 = 2;
  __l_02._M_len = 2;
  __l_02._M_array = local_98;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l_02);
  local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98;
  do {
    local_250 = local_250 + -1;
    std::__cxx11::string::~string((string *)local_250);
  } while (local_250 != &local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar.message_.ptr_ + 7));
  TApp::run((TApp *)this);
  local_128[0] = 1;
  local_128[1] = 2;
  local_120 = local_128;
  local_118 = 2;
  CLI::std::allocator<int>::allocator(&local_129);
  __l_01._M_len = local_118;
  __l_01._M_array = local_120;
  CLI::std::vector<int,_std::allocator<int>_>::vector(&local_110,__l_01,&local_129);
  testing::internal::EqHelper<false>::
  Compare<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((EqHelper<false> *)local_f8,"callback_order","std::vector<int>({1, 2})",
             (vector<int,_std::allocator<int>_> *)local_28,&local_110);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(&local_110);
  CLI::std::allocator<int>::~allocator(&local_129);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar2) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x280,pcVar3);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  CLI::App::reset(&(this->super_SubcommandProgram).super_TApp.app);
  CLI::std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)local_28);
  gtest_ar_1.message_.ptr_._5_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_190,"stop",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"start",(allocator *)((long)&gtest_ar_1.message_.ptr_ + 6))
  ;
  gtest_ar_1.message_.ptr_._5_1_ = 0;
  local_150 = &local_190;
  local_148 = 2;
  __l_00._M_len = 2;
  __l_00._M_array = local_150;
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->super_SubcommandProgram).super_TApp.args,__l_00);
  local_2c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_150;
  do {
    local_2c8 = local_2c8 + -1;
    std::__cxx11::string::~string((string *)local_2c8);
  } while (local_2c8 != &local_190);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
  TApp::run((TApp *)this);
  local_1e0[0] = 2;
  local_1e0[1] = 1;
  local_1d8 = local_1e0;
  local_1d0 = 2;
  CLI::std::allocator<int>::allocator(&local_1e1);
  __l._M_len = local_1d0;
  __l._M_array = local_1d8;
  CLI::std::vector<int,_std::allocator<int>_>::vector(&local_1c8,__l,&local_1e1);
  testing::internal::EqHelper<false>::
  Compare<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
            ((EqHelper<false> *)local_1b0,"callback_order","std::vector<int>({2, 1})",
             (vector<int,_std::allocator<int>_> *)local_28,&local_1c8);
  CLI::std::vector<int,_std::allocator<int>_>::~vector(&local_1c8);
  CLI::std::allocator<int>::~allocator(&local_1e1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar2) {
    testing::Message::Message(&local_1f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
               ,0x287,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    testing::Message::~Message(&local_1f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  CLI::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

TEST_F(SubcommandProgram, CallbackOrder) {
    std::vector<int> callback_order;
    start->set_callback([&callback_order]() { callback_order.push_back(1); });
    stop->set_callback([&callback_order]() { callback_order.push_back(2); });

    args = {"start", "stop"};
    run();
    EXPECT_EQ(callback_order, std::vector<int>({1, 2}));

    app.reset();
    callback_order.clear();

    args = {"stop", "start"};
    run();
    EXPECT_EQ(callback_order, std::vector<int>({2, 1}));
}